

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

void __thiscall CLI::App::parse(App *this,string *commandline,bool program_name_included)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  long lVar4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  undefined7 in_register_00000011;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  nstr;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  char *local_160;
  size_type local_158;
  char local_150;
  uint7 uStack_14f;
  undefined8 uStack_148;
  char *local_140;
  size_type local_138;
  char local_130;
  uint7 uStack_12f;
  undefined8 uStack_128;
  App *local_120;
  undefined1 local_118 [32];
  _Alloc_hider local_f8;
  char local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  undefined1 *local_58 [5];
  
  if ((int)CONCAT71(in_register_00000011,program_name_included) == 0) {
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(commandline->_M_dataplus)._M_p;
    local_118._0_8_ =
         (long)&((local_178.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
         commandline->_M_string_length;
    ::std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
              (local_58);
    commandline->_M_string_length = (long)local_58[0] - (long)(commandline->_M_dataplus)._M_p;
    *local_58[0] = 0;
    _Var3 = ::std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                      ();
    pcVar2 = (commandline->_M_dataplus)._M_p;
    if (pcVar2 + commandline->_M_string_length == _Var3._M_current) {
      commandline->_M_string_length = 0;
      *pcVar2 = '\0';
    }
    else {
      ::std::__cxx11::string::_M_erase((ulong)commandline,0);
    }
  }
  else {
    pcVar2 = (commandline->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar2,pcVar2 + commandline->_M_string_length);
    detail::split_program_name
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (((this->name_)._M_string_length == 0) || (this->has_automatic_name_ == true)) {
      this->has_automatic_name_ = true;
      ::std::__cxx11::string::_M_assign((string *)&this->name_);
    }
    ::std::__cxx11::string::operator=((string *)commandline,(string *)&local_f8);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
  }
  if (commandline->_M_string_length != 0) {
    pcVar2 = (commandline->_M_dataplus)._M_p;
    local_140 = &local_130;
    local_120 = this;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar2,pcVar2 + commandline->_M_string_length);
    local_b8[0] = local_a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"=","");
    lVar4 = ::std::__cxx11::string::find((char *)&local_140,(ulong)local_b8[0],0);
    if (lVar4 != -1) {
      do {
        if (((byte)local_140[lVar4 + 1] - 0x22 < 0x3f) &&
           ((0x4000000000000021U >> ((ulong)((byte)local_140[lVar4 + 1] - 0x22) & 0x3f) & 1) != 0))
        {
          lVar5 = ::std::__cxx11::string::find_last_of((char *)&local_140,0x187a1e,lVar4 - 1);
          if ((lVar5 != -1) && ((uint)(local_140[lVar4] != '=') * 2 + 0x2d == (int)local_140[lVar5])
             ) {
            local_140[lVar4] = ' ';
          }
        }
        lVar4 = ::std::__cxx11::string::find((char *)&local_140,(ulong)local_b8[0],lVar4 + 1);
      } while (lVar4 != -1);
    }
    if (local_140 == &local_130) {
      local_118._24_8_ = uStack_128;
      local_118._0_8_ = local_118 + 0x10;
    }
    else {
      local_118._0_8_ = local_140;
    }
    local_118._16_8_ = (ulong)uStack_12f << 8;
    local_118._8_8_ = local_138;
    local_138 = 0;
    local_130 = '\0';
    local_140 = &local_130;
    ::std::__cxx11::string::operator=((string *)commandline,(string *)local_118);
    this = local_120;
    if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
      operator_delete((void *)local_118._0_8_);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140);
    }
    if (this->allow_windows_style_options_ == true) {
      pcVar2 = (commandline->_M_dataplus)._M_p;
      local_160 = &local_150;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,pcVar2,pcVar2 + commandline->_M_string_length);
      local_d8[0] = local_c8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,":","");
      lVar4 = ::std::__cxx11::string::find((char *)&local_160,(ulong)local_d8[0],0);
      if (lVar4 != -1) {
        do {
          if (((byte)local_160[lVar4 + 1] - 0x22 < 0x3f) &&
             ((0x4000000000000021U >> ((ulong)((byte)local_160[lVar4 + 1] - 0x22) & 0x3f) & 1) != 0)
             ) {
            lVar5 = ::std::__cxx11::string::find_last_of((char *)&local_160,0x187a1e,lVar4 - 1);
            if ((lVar5 != -1) &&
               ((uint)(local_160[lVar4] != '=') * 2 + 0x2d == (int)local_160[lVar5])) {
              local_160[lVar4] = ' ';
            }
          }
          lVar4 = ::std::__cxx11::string::find((char *)&local_160,(ulong)local_d8[0],lVar4 + 1);
        } while (lVar4 != -1);
      }
      if (local_160 == &local_150) {
        local_118._24_8_ = uStack_148;
        local_118._0_8_ = local_118 + 0x10;
      }
      else {
        local_118._0_8_ = local_160;
      }
      local_118._16_8_ = (ulong)uStack_14f << 8;
      local_118._8_8_ = local_158;
      local_158 = 0;
      local_150 = '\0';
      local_160 = &local_150;
      ::std::__cxx11::string::operator=((string *)commandline,(string *)local_118);
      this = local_120;
      if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
        operator_delete((void *)local_118._0_8_);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
    }
  }
  local_98._M_dataplus._M_p = (commandline->_M_dataplus)._M_p;
  paVar1 = &commandline->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&commandline->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98._M_string_length = commandline->_M_string_length;
  (commandline->_M_dataplus)._M_p = (pointer)paVar1;
  commandline->_M_string_length = 0;
  (commandline->field_2)._M_local_buf[0] = '\0';
  detail::split_up(&local_178,&local_98,'\0');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  local_118._8_8_ = 0;
  local_118._16_8_ = local_118._16_8_ & 0xffffffffffffff00;
  local_118._0_8_ = local_118 + 0x10;
  __first = ::std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_178,(iterator)__first._M_current,
             (iterator)
             local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_);
  }
  detail::remove_quotes(&local_178);
  pbVar7 = local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  pbVar6 = local_178.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start < pbVar7 &&
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      ::std::__cxx11::string::swap((string *)pbVar6);
      pbVar6 = pbVar6 + 1;
      pbVar7 = pbVar7 + -1;
    } while (pbVar6 < pbVar7);
  }
  parse(this,&local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::string commandline, bool program_name_included) {

    if(program_name_included) {
        auto nstr = detail::split_program_name(commandline);
        if((name_.empty()) || (has_automatic_name_)) {
            has_automatic_name_ = true;
            name_ = nstr.first;
        }
        commandline = std::move(nstr.second);
    } else {
        detail::trim(commandline);
    }
    // the next section of code is to deal with quoted arguments after an '=' or ':' for windows like operations
    if(!commandline.empty()) {
        commandline = detail::find_and_modify(commandline, "=", detail::escape_detect);
        if(allow_windows_style_options_)
            commandline = detail::find_and_modify(commandline, ":", detail::escape_detect);
    }

    auto args = detail::split_up(std::move(commandline));
    // remove all empty strings
    args.erase(std::remove(args.begin(), args.end(), std::string{}), args.end());
    try {
        detail::remove_quotes(args);
    } catch(const std::invalid_argument &arg) {
        throw CLI::ParseError(arg.what(), CLI::ExitCodes::InvalidError);
    }
    std::reverse(args.begin(), args.end());
    parse(std::move(args));
}